

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

iterator __thiscall
GCPtr<symbols::RangeObject>::findPtrInfo(GCPtr<symbols::RangeObject> *this,RangeObject *ptr)

{
  list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_> *plVar1;
  
  plVar1 = &gclist_abi_cxx11_;
  do {
    plVar1 = (list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_> *)
             (plVar1->
             super__List_base<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar1 == &gclist_abi_cxx11_) {
      return (iterator)(_List_node_base *)plVar1;
    }
  } while ((RangeObject *)((_List_node_base *)((long)plVar1 + 0x10))->_M_prev != ptr);
  return (iterator)(_List_node_base *)plVar1;
}

Assistant:

typename list<GCInfo<T>>::iterator GCPtr<T>::findPtrInfo(T *ptr){
    typename list<GCInfo<T>>::iterator p;

    // Find ptr in gclist.
    for(p = gclist.begin(); p != gclist.end(); p++){
        if(p->memPtr == ptr)
            return p;
    }
    return p;
}